

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeWindowsListByBeginStackParent
               (ImGuiWindow **windows,int windows_size,ImGuiWindow *parent_in_begin_stack)

{
  long lVar1;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  char buf [20];
  ImGuiWindow *window;
  int i;
  char *in_stack_00000060;
  ImGuiWindow *in_stack_00000068;
  char acStack_48 [28];
  float in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined4 in_stack_fffffffffffffff0;
  
  for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
    lVar1 = *(long *)(in_RDI + (long)iVar2 * 8);
    if (*(long *)(lVar1 + 0x348) == in_RDX) {
      ImFormatString(acStack_48,0x14,"[%04d] Window",(ulong)(uint)(int)*(short *)(lVar1 + 0x9e));
      DebugNodeWindow(in_stack_00000068,in_stack_00000060);
      Indent(in_stack_ffffffffffffffd4);
      DebugNodeWindowsListByBeginStackParent
                ((ImGuiWindow **)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 (int)((ulong)in_RDX >> 0x20),
                 (ImGuiWindow *)CONCAT44(iVar2,in_stack_ffffffffffffffe0));
      Unindent(in_stack_ffffffffffffffd4);
    }
  }
  return;
}

Assistant:

void ImGui::DebugNodeWindowsListByBeginStackParent(ImGuiWindow** windows, int windows_size, ImGuiWindow* parent_in_begin_stack)
{
    for (int i = 0; i < windows_size; i++)
    {
        ImGuiWindow* window = windows[i];
        if (window->ParentWindowInBeginStack != parent_in_begin_stack)
            continue;
        char buf[20];
        ImFormatString(buf, IM_ARRAYSIZE(buf), "[%04d] Window", window->BeginOrderWithinContext);
        //BulletText("[%04d] Window '%s'", window->BeginOrderWithinContext, window->Name);
        DebugNodeWindow(window, buf);
        Indent();
        DebugNodeWindowsListByBeginStackParent(windows + i + 1, windows_size - i - 1, window);
        Unindent();
    }
}